

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_hash.c
# Opt level: O3

ion_err_t linear_hash_get_bucket
                    (ion_fpos_t bucket_loc,linear_hash_bucket_t *bucket,
                    linear_hash_table_t *linear_hash)

{
  ion_err_t iVar1;
  int iVar2;
  size_t sVar3;
  undefined8 local_38;
  ion_fpos_t local_30;
  
  if ((FILE *)linear_hash->database == (FILE *)0x0) {
    iVar1 = '\n';
  }
  else {
    local_30 = 0x10ca70;
    iVar2 = fseek((FILE *)linear_hash->database,bucket_loc,0);
    iVar1 = '\r';
    if (iVar2 == 0) {
      sVar3 = fread(&local_38,0x10,1,(FILE *)linear_hash->database);
      iVar1 = '\b';
      if (sVar3 == 1) {
        bucket->idx = (undefined4)local_38;
        bucket->record_count = local_38._4_4_;
        bucket->overflow_location = local_30;
        iVar1 = '\0';
      }
    }
  }
  return iVar1;
}

Assistant:

ion_err_t
linear_hash_get_bucket(
	ion_fpos_t				bucket_loc,
	linear_hash_bucket_t	*bucket,
	linear_hash_table_t		*linear_hash
) {
	if (bucket_loc == -1) {}

	/* check if file is open */
	if (!linear_hash->database) {
		return err_file_close_error;
	}

	/* seek to location of record in file */
	if (0 != fseek(linear_hash->database, bucket_loc, SEEK_SET)) {
		return err_file_bad_seek;
	}

	ion_byte_t *bucket_cache = alloca(sizeof(linear_hash_bucket_t));

	if (1 != fread(bucket_cache, sizeof(linear_hash_bucket_t), 1, linear_hash->database)) {
		return err_file_read_error;
	}

	/* read record data elements */
	memcpy(&bucket->idx, bucket_cache, sizeof(int));
	memcpy(&bucket->record_count, bucket_cache + sizeof(int), sizeof(int));
	memcpy(&bucket->overflow_location, bucket_cache + 2 * sizeof(int), sizeof(ion_fpos_t));

	return err_ok;
}